

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O0

int metaIndex(lua_State *L)

{
  dll_lua_pushnumber p_Var1;
  dll_lua_pushstring p_Var2;
  bool bVar3;
  undefined8 *puVar4;
  char *pcVar5;
  Variable *pVVar6;
  allocator local_49;
  undefined1 local_48 [8];
  string k;
  Idx<Variable> var;
  Idx<Variable> *pVar;
  lua_State *L_local;
  
  puVar4 = (undefined8 *)(*lua_touserdata)(L,1);
  k.field_2._8_8_ = *puVar4;
  pcVar5 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar5,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"name");
  p_Var2 = lua_pushstring;
  if (bVar3) {
    Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    (*p_Var2)(L,pcVar5);
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"value");
    p_Var2 = lua_pushstring;
    if (bVar3) {
      Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      (*p_Var2)(L,pcVar5);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"valueType");
      p_Var1 = lua_pushnumber;
      if (bVar3) {
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
        (*p_Var1)(L,(double)pVVar6->valueType);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"valueTypeName");
        p_Var2 = lua_pushstring;
        if (bVar3) {
          Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
          pcVar5 = (char *)std::__cxx11::string::c_str();
          (*p_Var2)(L,pcVar5);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"addChild");
          if (bVar3) {
            (*lua_pushcclosure)(L,metaAddChild,0);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"query");
            if (bVar3) {
              (*lua_pushcclosure)(L,metaQuery,0);
            }
            else {
              (*lua_pushnil)(L);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return 1;
}

Assistant:

int metaIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		lua_pushstring(L, var->name.c_str());
	}
	else if (k == "value")
	{
		lua_pushstring(L, var->value.c_str());
	}
	else if (k == "valueType")
	{
		lua_pushnumber(L, var->valueType);
	}
	else if (k == "valueTypeName")
	{
		lua_pushstring(L, var->valueTypeName.c_str());
	}
	else if (k == "addChild")
	{
		lua_pushcfunction(L, metaAddChild);
	}
	else if (k == "query")
	{
		lua_pushcfunction(L, metaQuery);
	}
	else
	{
		lua_pushnil(L);
	}
	return 1;
}